

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_if_else.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  Taskflow *this;
  void *__stat_loc;
  Task grtr3;
  Task equl3;
  Task equl2;
  Task equl1;
  Task cond3;
  Task cond2;
  Task cond1;
  Task initi;
  int i;
  Taskflow taskflow;
  Executor executor;
  ostream *in_stack_fffffffffffffd18;
  Executor *this_00;
  element_type *in_stack_fffffffffffffd30;
  Taskflow *in_stack_fffffffffffffd40;
  Executor *in_stack_fffffffffffffd50;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd60;
  FlowBuilder *in_stack_fffffffffffffd68;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  Executor *in_stack_fffffffffffffe18;
  Executor local_150;
  int local_4;
  
  local_4 = 0;
  uVar1 = std::thread::hardware_concurrency();
  this = (Taskflow *)(ulong)uVar1;
  this_00 = &local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)this,in_stack_fffffffffffffd18);
  tf::Executor::Executor
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x10487a);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffd40);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_nested_if_else_cpp:13:33),_nullptr>
            (in_stack_fffffffffffffd68,(anon_class_8_1_54a39809 *)in_stack_fffffffffffffd60);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_nested_if_else_cpp:14:33),_nullptr>
            (in_stack_fffffffffffffd68,(anon_class_8_1_54a39809 *)in_stack_fffffffffffffd60);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_nested_if_else_cpp:15:33),_nullptr>
            (in_stack_fffffffffffffd68,(anon_class_8_1_54a39809 *)in_stack_fffffffffffffd60);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_nested_if_else_cpp:16:33),_nullptr>
            (in_stack_fffffffffffffd68,(anon_class_8_1_54a39809 *)in_stack_fffffffffffffd60);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_nested_if_else_cpp:17:33),_nullptr>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_nested_if_else_cpp:18:33),_nullptr>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_nested_if_else_cpp:19:33),_nullptr>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_nested_if_else_cpp:20:33),_nullptr>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  tf::Task::precede<tf::Task&>((Task *)this,(Task *)in_stack_fffffffffffffd18);
  tf::Task::precede<tf::Task&,tf::Task&>
            ((Task *)in_stack_fffffffffffffd30,(Task *)this_00,(Task *)this);
  tf::Task::precede<tf::Task&,tf::Task&>
            ((Task *)in_stack_fffffffffffffd30,(Task *)this_00,(Task *)this);
  tf::Task::precede<tf::Task&,tf::Task&>
            ((Task *)in_stack_fffffffffffffd30,(Task *)this_00,(Task *)this);
  tf::Taskflow::dump(this,in_stack_fffffffffffffd18);
  __stat_loc = (void *)((long)&local_150._taskflows_mutex.super___mutex_base._M_mutex + 0x10);
  tf::Executor::run(this_00,this);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffd30,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)this);
  local_4 = 0;
  tf::Taskflow::~Taskflow(this);
  tf::Executor::~Executor(in_stack_fffffffffffffd50);
  return local_4;
}

Assistant:

int main() {

  tf::Executor executor;
  tf::Taskflow taskflow;

  int i;

  // create three condition tasks for nested control flow
  auto initi = taskflow.emplace([&](){ i=3; });
  auto cond1 = taskflow.emplace([&](){ return i>1 ? 1 : 0; });
  auto cond2 = taskflow.emplace([&](){ return i>2 ? 1 : 0; });
  auto cond3 = taskflow.emplace([&](){ return i>3 ? 1 : 0; });
  auto equl1 = taskflow.emplace([&](){ std::cout << "i=1\n"; });
  auto equl2 = taskflow.emplace([&](){ std::cout << "i=2\n"; });
  auto equl3 = taskflow.emplace([&](){ std::cout << "i=3\n"; });
  auto grtr3 = taskflow.emplace([&](){ std::cout << "i>3\n"; });

  initi.precede(cond1);
  cond1.precede(equl1, cond2);
  cond2.precede(equl2, cond3);
  cond3.precede(equl3, grtr3);

  // dump the conditioned flow
  taskflow.dump(std::cout);

  executor.run(taskflow).wait();

  return 0;
}